

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.cpp
# Opt level: O2

string * __thiscall
MinVR::VRSearchPath::getFullFilenames
          (string *__return_storage_ptr__,VRSearchPath *this,string *desiredFile)

{
  _List_node_base *p_Var1;
  string out;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  p_Var1 = (_List_node_base *)&this->_searchPath;
  while (p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->_searchPath) {
    (**this->_vptr_VRSearchPath)(&local_70,this,desiredFile,p_Var1 + 1);
    std::operator+(&local_50,&local_70,":");
    std::__cxx11::string::append((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string VRSearchPath::getFullFilenames(const std::string &desiredFile) const {

    std::string out;
    for (std::list<std::string>::const_iterator it = _searchPath.begin();
         it != _searchPath.end(); it++)
        out += _selectFile(desiredFile, (*it)) + ":";

    return out.substr(0, out.length() - 1);
}